

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VaultClient.h
# Opt level: O0

Namespace * __thiscall
Vault::Client::getNamespace_abi_cxx11_(Namespace *__return_storage_ptr__,Client *this)

{
  Client *this_local;
  
  Tiny<Vault::NamespaceDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Tiny(__return_storage_ptr__,
         (Tiny<Vault::NamespaceDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)(this + 0x70));
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] virtual Namespace getNamespace() const { return namespace_; }